

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int gettime(event_base *base,timeval *tp)

{
  int iVar1;
  undefined1 local_30 [8];
  timeval tv;
  timeval *tp_local;
  event_base *base_local;
  
  tv.tv_usec = (__suseconds_t)tp;
  if (((base->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) &&
     (iVar1 = evthread_is_debug_lock_held_(base->th_base_lock), iVar1 == 0)) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,0x19f,"evthread_is_debug_lock_held_((base)->th_base_lock)","gettime");
  }
  if ((base->tv_cache).tv_sec == 0) {
    iVar1 = evutil_gettime_monotonic_(&base->monotonic_timer,(timeval *)tv.tv_usec);
    if (iVar1 == -1) {
      base_local._4_4_ = -1;
    }
    else {
      if (base->last_updated_clock_diff + 5 < *(long *)tv.tv_usec) {
        gettimeofday((timeval *)local_30,(__timezone_ptr_t)0x0);
        (base->tv_clock_diff).tv_sec = (long)local_30 - *(long *)tv.tv_usec;
        (base->tv_clock_diff).tv_usec = tv.tv_sec - *(long *)(tv.tv_usec + 8);
        if ((base->tv_clock_diff).tv_usec < 0) {
          (base->tv_clock_diff).tv_sec = (base->tv_clock_diff).tv_sec + -1;
          (base->tv_clock_diff).tv_usec = (base->tv_clock_diff).tv_usec + 1000000;
        }
        base->last_updated_clock_diff = *(time_t *)tv.tv_usec;
      }
      base_local._4_4_ = 0;
    }
  }
  else {
    *(__time_t *)tv.tv_usec = (base->tv_cache).tv_sec;
    *(__suseconds_t *)(tv.tv_usec + 8) = (base->tv_cache).tv_usec;
    base_local._4_4_ = 0;
  }
  return base_local._4_4_;
}

Assistant:

static int
gettime(struct event_base *base, struct timeval *tp)
{
	EVENT_BASE_ASSERT_LOCKED(base);

	if (base->tv_cache.tv_sec) {
		*tp = base->tv_cache;
		return (0);
	}

	if (evutil_gettime_monotonic_(&base->monotonic_timer, tp) == -1) {
		return -1;
	}

	if (base->last_updated_clock_diff + CLOCK_SYNC_INTERVAL
	    < tp->tv_sec) {
		struct timeval tv;
		evutil_gettimeofday(&tv,NULL);
		evutil_timersub(&tv, tp, &base->tv_clock_diff);
		base->last_updated_clock_diff = tp->tv_sec;
	}

	return 0;
}